

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GradeBook.cpp
# Opt level: O0

GradeBook * __thiscall GradeBook::getCourseName_abi_cxx11_(GradeBook *this)

{
  string *in_RSI;
  GradeBook *this_local;
  
  std::__cxx11::string::string((string *)this,in_RSI);
  return this;
}

Assistant:

std::string GradeBook::getCourseName() { return courseName; }